

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O0

void __thiscall
jwt::token_verification_exception::token_verification_exception
          (token_verification_exception *this,string *msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *msg_local;
  token_verification_exception *this_local;
  
  local_18 = msg;
  msg_local = (string *)this;
  std::operator+(&local_38,"token verification failed: ",msg);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__token_verification_exception_0012ace0;
  return;
}

Assistant:

explicit token_verification_exception(const std::string& msg)
			: std::runtime_error("token verification failed: " + msg)
		{}